

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conflict.cpp
# Opt level: O2

void __thiscall
SAT::getLearntClause
          (SAT *this,int nodeid,set<int,_std::less<int>,_std::allocator<int>_> *contributingNogoods)

{
  vec<int> *this_00;
  char *pcVar1;
  anon_union_8_2_743a5d44_for_Reason_0 aVar2;
  char cVar3;
  uint uVar4;
  vec<Lit> *pvVar5;
  ostream *poVar6;
  Lit *pLVar7;
  Clause *this_01;
  Lit p;
  uint uVar8;
  uint i;
  ulong uVar9;
  int local_88;
  Lit q;
  anon_union_8_2_743a5d44_for_Reason_0 local_70;
  int local_68 [8];
  _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *local_48;
  vec<int> *local_40;
  vec<Lit> *local_38;
  
  p.x = ::lit_Undef.x;
  local_48 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
             contributingNogoods;
  uVar4 = findConflictLevel(this);
  this_01 = this->confl;
  pvVar5 = (this->trail).data + uVar4;
  if (so.debug == true) {
    std::operator<<((ostream *)&std::cerr,"trail of conflict level:");
    for (uVar9 = 0; uVar9 < pvVar5->sz; uVar9 = uVar9 + 1) {
      std::operator<<((ostream *)&std::cerr," ");
      getLitString_abi_cxx11_(q.x);
      std::operator<<((ostream *)&std::cerr,(string *)local_68);
      std::__cxx11::string::~string((string *)local_68);
    }
    std::operator<<((ostream *)&std::cerr,"\n");
  }
  this->index = pvVar5->sz;
  local_38 = &this->out_learnt;
  if ((this->out_learnt).data != (Lit *)0x0) {
    local_38->sz = 0;
  }
  this_00 = &this->out_learnt_level;
  if ((this->out_learnt_level).data != (int *)0x0) {
    this_00->sz = 0;
  }
  vec<Lit>::push(local_38);
  local_40 = this_00;
  vec<int>::push(this_00);
  local_70._pt = (Clause *)0x0;
  local_88 = 0;
  do {
    if ((*(uint *)this_01 & 1) != 0) {
      uVar4 = *(uint *)this_01 >> 8;
      this_01->data[uVar4].x = (int)((float)this->cla_inc + (float)this_01->data[uVar4].x);
      this_01[1].data[(ulong)uVar4 - 1].x = this_01[1].data[(ulong)uVar4 - 1].x + 1;
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>(local_48,&this_01[1].data[uVar4].x);
    }
    if (so.print_implications == true) {
      cVar3 = std::__basic_file<char>::is_open();
      if (cVar3 == '\0') {
        std::ofstream::open(implication_stream,0x1b3acd);
      }
      std::ostream::operator<<((ostream *)implication_stream,nodeid);
      std::operator<<((ostream *)implication_stream,",");
      if (p.x == ::lit_Undef.x) {
        std::operator<<((ostream *)implication_stream,"false");
      }
      else {
        getLitString_abi_cxx11_(q.x);
        std::operator<<((ostream *)implication_stream,(string *)local_68);
        std::__cxx11::string::~string((string *)local_68);
      }
      std::operator<<((ostream *)implication_stream,",");
      for (uVar4 = (uint)(p.x != ::lit_Undef.x); uVar4 < *(uint *)this_01 >> 8; uVar4 = uVar4 + 1) {
        poVar6 = std::operator<<((ostream *)implication_stream," ");
        Clause::operator[](this_01,uVar4);
        getLitString_abi_cxx11_(q.x);
        std::operator<<(poVar6,(string *)local_68);
        std::__cxx11::string::~string((string *)local_68);
      }
      std::operator<<((ostream *)implication_stream,"\n");
    }
    if (so.debug == true) {
      if (((ulong)*this_01 & 1) != 0) {
        poVar6 = std::operator<<((ostream *)&std::cerr,"L");
        poVar6 = (ostream *)
                 std::ostream::operator<<
                           ((ostream *)poVar6,this_01[1].data[*(uint *)this_01 >> 8].x);
        std::operator<<(poVar6," ");
      }
      std::operator<<((ostream *)&std::cerr,"\t");
      if (p.x == ::lit_Undef.x) {
        std::operator<<((ostream *)&std::cerr,"false");
      }
      else {
        getLitString_abi_cxx11_(q.x);
        std::operator<<((ostream *)&std::cerr,(string *)local_68);
        std::__cxx11::string::~string((string *)local_68);
      }
      std::operator<<((ostream *)&std::cerr,"  <-");
      for (uVar4 = (uint)(p.x != ::lit_Undef.x); uVar4 < *(uint *)this_01 >> 8; uVar4 = uVar4 + 1) {
        poVar6 = std::operator<<((ostream *)&std::cerr,"  \t");
        Clause::operator[](this_01,uVar4);
        getLitString_abi_cxx11_(q.x);
        std::operator<<(poVar6,(string *)local_68);
        std::__cxx11::string::~string((string *)local_68);
      }
      std::operator<<((ostream *)&std::cerr,"\n");
    }
    for (uVar4 = (uint)(p.x != ::lit_Undef.x); uVar4 < *(uint *)this_01 >> 8; uVar4 = uVar4 + 1) {
      pLVar7 = Clause::operator[](this_01,uVar4);
      q.x = pLVar7->x;
      uVar8 = q.x >> 1;
      if ((this->seen).data[uVar8] == '\0') {
        varBumpActivity(this,q);
        (this->seen).data[uVar8] = '\x01';
        if ((this->trailpos).data[uVar8] < engine.trail_lim.data[engine.trail_lim.sz - 1]) {
          if (so.debug == true) {
            poVar6 = std::operator<<((ostream *)&std::cerr,"added ");
            getLitString_abi_cxx11_(q.x);
            poVar6 = std::operator<<(poVar6,(string *)local_68);
            std::operator<<(poVar6," to nogood\n");
            std::__cxx11::string::~string((string *)local_68);
          }
          vec<Lit>::push(local_38,&q);
          local_68[0] = getLevel(this,uVar8);
          vec<int>::push(local_40,local_68);
        }
        else {
          local_88 = local_88 + 1;
          if (so.debug == true) {
            getLitString_abi_cxx11_(q.x);
            poVar6 = std::operator<<((ostream *)&std::cerr,(string *)local_68);
            poVar6 = std::operator<<(poVar6," is from current level; incremented pathC to ");
            poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,local_88);
            std::operator<<(poVar6,"\n");
            goto LAB_0019dad7;
          }
        }
      }
      else if (so.debug == true) {
        getLitString_abi_cxx11_(q.x);
        poVar6 = std::operator<<((ostream *)&std::cerr,(string *)local_68);
        std::operator<<(poVar6," already marked as seen; skipping explanation\n");
LAB_0019dad7:
        std::__cxx11::string::~string((string *)local_68);
      }
    }
    while( true ) {
      pLVar7 = pvVar5->data;
      pcVar1 = (this->seen).data;
      uVar4 = this->index;
      do {
        uVar4 = uVar4 - 1;
        this->index = uVar4;
        p.x = pLVar7[uVar4].x;
        uVar8 = p.x >> 1;
      } while (pcVar1[uVar8] == '\0');
      pcVar1[uVar8] = '\0';
      if (so.debug == true) {
        poVar6 = std::operator<<((ostream *)&std::cerr,"selected ");
        getLitString_abi_cxx11_(q.x);
        poVar6 = std::operator<<(poVar6,(string *)local_68);
        std::operator<<(poVar6," as next literal to explain away\n");
        std::__cxx11::string::~string((string *)local_68);
      }
      local_88 = local_88 + -1;
      if ((local_88 == 0) && (((uint)(this->flags).data[uVar8] & 2) != 0)) {
        if (so.debug == true) {
          std::operator<<((ostream *)&std::cerr,"one only literal left at current level; finished\n"
                         );
        }
        ((this->out_learnt).data)->x = p.x ^ 1;
        *(this->out_learnt_level).data = (this->trail).sz - 2;
        return;
      }
      aVar2 = (anon_union_8_2_743a5d44_for_Reason_0)(this->reason).data[uVar8].field_0._pt;
      if (local_70._pt != aVar2._pt) break;
      if (so.debug == true) {
        std::operator<<((ostream *)&std::cerr,
                        "same reason as previously explained literal; skipping\n");
      }
    }
    this_01 = getExpl(this,p);
    local_70 = aVar2;
  } while( true );
}

Assistant:

void SAT::getLearntClause(int nodeid, std::set<int>& contributingNogoods) {
	Lit p = lit_Undef;
	int pathC = 0;
	const int clevel = findConflictLevel();
	vec<Lit>& ctrail = trail[clevel];
	Clause* expl = confl;
	Reason last_reason = nullptr;

	if (so.debug) {
		std::cerr << "trail of conflict level:";
		for (unsigned int i = 0; i < ctrail.size(); i++) {
			std::cerr << " ";
			std::cerr << getLitString(toInt(ctrail[i]));
		}
		std::cerr << "\n";
	}

	index = ctrail.size();
	out_learnt.clear();
	out_learnt_level.clear();
	out_learnt.push();  // (leave room for the asserting literal)
	out_learnt_level.push();

	while (true) {
		assert(expl != nullptr);  // (otherwise should be UIP)
		Clause& c = *expl;

		if (PRINT_ANALYSIS) {
			if (p != lit_Undef) {
				c[0] = p;
			}
			printClause(c);
		}

		if (c.learnt) {
			c.activity() += static_cast<float>(cla_inc);
			c.rawActivity() += 1;
			contributingNogoods.insert(c.clauseID());
		}

		/* if (so.debug) { */
		/*   if (p == lit_Undef) { */
		/*     std::cerr << "explaining away failure (" << decisionLevel() << ")\n"; */
		/*   } else { */
		/*     std::cerr << "explaining away " << getLitString(toInt(p)) << " (lit number " << toInt(p)
		 * << ", level " << getLevel(var(p)) << ")\n"; */
		/*   } */
		/*   std::cerr << "expl:"; */
		/*   for (int i = (p == lit_Undef ? 0 : 1) ; i < c.size() ; i++) */
		/*     std::cerr << " " << getLitString(toInt(~c[i])); */
		/*   std::cerr << "\n"; */
		/* } */

		if (so.print_implications) {
			if (!implication_stream.is_open()) {
				implication_stream.open("implication-log.csv");
			}

			implication_stream << nodeid;
			implication_stream << ",";
			if (p == lit_Undef) {
				implication_stream << "false";
			} else {
				implication_stream << getLitString(toInt(p));
			}
			implication_stream << ",";
			for (unsigned int i = (p == lit_Undef ? 0 : 1); i < c.size(); i++) {
				implication_stream << " " << getLitString(toInt(~c[i]));
			}
			implication_stream << "\n";
		}

		if (so.debug) {
			if (c.learnt) {
				std::cerr << "L" << c.clauseID() << " ";
			}
			std::cerr << "\t";

			if (p == lit_Undef) {
				std::cerr << "false";
			} else {
				std::cerr << getLitString(toInt(p));
			}
			std::cerr << "  <-";
			for (unsigned int i = (p == lit_Undef ? 0 : 1); i < c.size(); i++) {
				std::cerr << "  \t" << getLitString(toInt(~c[i]));
			}
			std::cerr << "\n";
		}

		for (unsigned int j = (p == lit_Undef) ? 0 : 1; j < c.size(); j++) {
			const Lit q = c[j];
			const int x = var(q);
			/* if (so.debug) { */
			/*   std::cerr << "adding " << getLitString(toInt(~q)) << " (lit number " << toInt(~q) << ",
			 * var " << x << ") from level " << getLevel(x); */
			/* } */
			if (seen[x] == 0) {
				varBumpActivity(q);
				seen[x] = 1;
				if (isCurLevel(x)) {
					pathC++;
					if (so.debug) {
						std::cerr << getLitString(toInt(~q)) << " is from current level; incremented pathC to "
											<< pathC << "\n";
					}
				} else {
					if (so.debug) {
						std::cerr << "added " << getLitString(toInt(~q)) << " to nogood\n";
					}
					out_learnt.push(q);
					out_learnt_level.push(getLevel(x));
				}
			} else {
				if (so.debug) {
					//                            std::cerr << " but already seen this variable";
					std::cerr << getLitString(toInt(~q)) << " already marked as seen; skipping explanation\n";
				}
			}
			/* if (so.debug) { */
			/*   std::cerr << ", pathC is now " << pathC << "\n"; */
			/* } */
		}

	FindNextExpl:

		assert(pathC > 0);

		// Select next clause to look at:
		while (seen[var(ctrail[--index])] == 0) {
			;
		}
		assert(index >= 0);
		p = ctrail[index];
		seen[var(p)] = 0;
		pathC--;

		if (so.debug) {
			std::cerr << "selected " << getLitString(toInt(p)) << " as next literal to explain away\n";
		}

		if (pathC == 0 && flags[var(p)].uipable()) {
			if (so.debug) {
				std::cerr << "one only literal left at current level; finished\n";
			}
			break;
		}

		// This appears to be just an optimisation.
		if (last_reason == reason[var(p)]) {
			if (so.debug) {
				std::cerr << "same reason as previously explained literal; skipping\n";
			}
			goto FindNextExpl;
		}
		last_reason = reason[var(p)];
		expl = getExpl(p);
	}

	out_learnt[0] = ~p;
	out_learnt_level[0] = decisionLevel() - 1;
}